

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::layout_for_member_abi_cxx11_
          (CompilerGLSL *this,SPIRType *type,uint32_t index)

{
  bool bVar1;
  uint32_t id;
  mapped_type *pmVar2;
  ulong uVar3;
  size_t sVar4;
  CompilerError *pCVar5;
  uint in_ECX;
  undefined4 in_register_00000014;
  bool local_359;
  spirv_cross local_338 [38];
  allocator local_312;
  undefined1 local_311;
  undefined4 local_310;
  allocator local_309;
  spirv_cross local_308 [32];
  spirv_cross local_2e8 [38];
  undefined1 local_2c2;
  allocator local_2c1;
  string local_2c0 [32];
  spirv_cross local_2a0 [38];
  undefined1 local_27a;
  allocator local_279;
  string local_278 [39];
  allocator local_251;
  string local_250 [32];
  spirv_cross local_230 [39];
  allocator local_209;
  string local_208 [32];
  undefined1 local_1e8 [8];
  Bitset flags;
  string local_1a0 [36];
  uint32_t local_17c;
  undefined1 local_178 [8];
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  attr;
  Decoration *dec;
  VectorView<spirv_cross::Meta::Decoration> *local_50;
  Vector<Decoration> *memb;
  uint32_t local_40;
  uint32_t local_3c;
  bool local_35;
  bool is_block;
  allocator local_25;
  uint local_24;
  SPIRType *pSStack_20;
  uint32_t index_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  string *res;
  
  pSStack_20 = (SPIRType *)CONCAT44(in_register_00000014,index);
  local_24 = in_ECX;
  type_local = type;
  this_local = this;
  bVar1 = is_legacy((CompilerGLSL *)type);
  if (bVar1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"",&local_25);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_25);
  }
  else {
    local_3c = (pSStack_20->super_IVariant).self.id;
    bVar1 = Compiler::has_decoration((Compiler *)type,(ID)local_3c,DecorationBlock);
    local_359 = true;
    if (!bVar1) {
      local_40 = (pSStack_20->super_IVariant).self.id;
      local_359 = Compiler::has_decoration((Compiler *)type,(ID)local_40,DecorationBufferBlock);
    }
    local_35 = local_359;
    if (local_359 == false) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"",(allocator *)((long)&memb + 7));
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&memb + 7));
    }
    else {
      pmVar2 = ::std::
               unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
               ::operator[]((unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                             *)&(type->image).depth,&(pSStack_20->super_IVariant).self);
      local_50 = &(pmVar2->members).super_VectorView<spirv_cross::Meta::Decoration>;
      uVar3 = (ulong)local_24;
      sVar4 = VectorView<spirv_cross::Meta::Decoration>::size(local_50);
      if (uVar3 < sVar4) {
        attr.stack_storage.aligned_char._248_8_ =
             VectorView<spirv_cross::Meta::Decoration>::operator[](local_50,(ulong)local_24);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_178);
        local_17c = (uint32_t)
                    TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_20->super_IVariant).self)
        ;
        bVar1 = Compiler::has_member_decoration
                          ((Compiler *)type,(TypeID)local_17c,local_24,DecorationPassthroughNV);
        if (bVar1) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_1a0,"passthrough",
                     (allocator *)((long)&flags.higher._M_h._M_single_bucket + 7));
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_178,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0
                     );
          ::std::__cxx11::string::~string(local_1a0);
          ::std::allocator<char>::~allocator
                    ((allocator<char> *)((long)&flags.higher._M_h._M_single_bucket + 7));
        }
        Compiler::combined_decoration_for_member
                  ((Bitset *)local_1e8,(Compiler *)type,pSStack_20,local_24);
        bVar1 = Bitset::get((Bitset *)local_1e8,4);
        if (bVar1) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_208,"row_major",&local_209);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_178,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208
                     );
          ::std::__cxx11::string::~string(local_208);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_209);
        }
        bVar1 = Bitset::get((Bitset *)(attr.stack_storage.aligned_char._248_8_ + 0x80),0x1e);
        if ((bVar1) &&
           (bVar1 = can_use_io_location((CompilerGLSL *)type,pSStack_20->storage,true), bVar1)) {
          join<char_const(&)[12],unsigned_int&>
                    (local_230,(char (*) [12])"location = ",
                     (uint *)(attr.stack_storage.aligned_char._248_8_ + 0xc4));
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_178,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230
                     );
          ::std::__cxx11::string::~string((string *)local_230);
        }
        bVar1 = Bitset::get((Bitset *)(attr.stack_storage.aligned_char._248_8_ + 0x80),0x1f);
        if ((bVar1) &&
           (bVar1 = can_use_io_location((CompilerGLSL *)type,pSStack_20->storage,true), bVar1)) {
          if ((type[0x16].image.type.id & 1) != 0) {
            local_2c2 = 1;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_2c0,"Component decoration is not supported in ES targets.",&local_2c1);
            CompilerError::CompilerError(pCVar5,(string *)local_2c0);
            local_2c2 = 0;
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if ((*(uint *)(type[0x16].member_type_index_redirection.stack_storage.aligned_char + 0x1c)
               < 0x1b8) &&
             (0x8b < *(uint *)(type[0x16].member_type_index_redirection.stack_storage.aligned_char +
                              0x1c))) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_250,"GL_ARB_enhanced_layouts",&local_251);
            require_extension_internal((CompilerGLSL *)type,(string *)local_250);
            ::std::__cxx11::string::~string(local_250);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_251);
          }
          else if (*(uint *)(type[0x16].member_type_index_redirection.stack_storage.aligned_char +
                            0x1c) < 0x8c) {
            local_27a = 1;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_278,"Component decoration is not supported in targets below GLSL 1.40."
                       ,&local_279);
            CompilerError::CompilerError(pCVar5,(string *)local_278);
            local_27a = 0;
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          join<char_const(&)[13],unsigned_int&>
                    (local_2a0,(char (*) [13])"component = ",
                     (uint *)(attr.stack_storage.aligned_char._248_8_ + 200));
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_178,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0
                     );
          ::std::__cxx11::string::~string((string *)local_2a0);
        }
        id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_20->super_IVariant).self);
        bVar1 = Compiler::has_extended_decoration
                          ((Compiler *)type,id,SPIRVCrossDecorationExplicitOffset);
        if ((bVar1) &&
           (bVar1 = Bitset::get((Bitset *)(attr.stack_storage.aligned_char._248_8_ + 0x80),0x23),
           bVar1)) {
          join<char_const(&)[10],unsigned_int&>
                    (local_2e8,(char (*) [10])0x5e4165,
                     (uint *)(attr.stack_storage.aligned_char._248_8_ + 0xd4));
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_178,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8
                     );
          ::std::__cxx11::string::~string((string *)local_2e8);
        }
        else if ((pSStack_20->storage == StorageClassOutput) &&
                (bVar1 = Bitset::get((Bitset *)(attr.stack_storage.aligned_char._248_8_ + 0x80),0x23
                                    ), bVar1)) {
          join<char_const(&)[14],unsigned_int&>
                    (local_308,(char (*) [14])0x5e4161,
                     (uint *)(attr.stack_storage.aligned_char._248_8_ + 0xd4));
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_178,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308
                     );
          ::std::__cxx11::string::~string((string *)local_308);
        }
        bVar1 = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::empty((VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_178);
        if (bVar1) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"",&local_309);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_309);
        }
        else {
          local_311 = 0;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"layout(",&local_312);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_312);
          merge(local_338,
                (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_178,", ");
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_338);
          ::std::__cxx11::string::~string((string *)local_338);
          ::std::__cxx11::string::operator+=((string *)this,") ");
          local_311 = 1;
        }
        local_310 = 1;
        Bitset::~Bitset((Bitset *)local_1e8);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                        *)local_178);
      }
      else {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)this,"",(allocator *)((long)&dec + 7));
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&dec + 7));
      }
    }
  }
  return this;
}

Assistant:

string CompilerGLSL::layout_for_member(const SPIRType &type, uint32_t index)
{
	if (is_legacy())
		return "";

	bool is_block = has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock);
	if (!is_block)
		return "";

	auto &memb = ir.meta[type.self].members;
	if (index >= memb.size())
		return "";
	auto &dec = memb[index];

	SmallVector<string> attr;

	if (has_member_decoration(type.self, index, DecorationPassthroughNV))
		attr.push_back("passthrough");

	// We can only apply layouts on members in block interfaces.
	// This is a bit problematic because in SPIR-V decorations are applied on the struct types directly.
	// This is not supported on GLSL, so we have to make the assumption that if a struct within our buffer block struct
	// has a decoration, it was originally caused by a top-level layout() qualifier in GLSL.
	//
	// We would like to go from (SPIR-V style):
	//
	// struct Foo { layout(row_major) mat4 matrix; };
	// buffer UBO { Foo foo; };
	//
	// to
	//
	// struct Foo { mat4 matrix; }; // GLSL doesn't support any layout shenanigans in raw struct declarations.
	// buffer UBO { layout(row_major) Foo foo; }; // Apply the layout on top-level.
	auto flags = combined_decoration_for_member(type, index);

	if (flags.get(DecorationRowMajor))
		attr.push_back("row_major");
	// We don't emit any global layouts, so column_major is default.
	//if (flags & (1ull << DecorationColMajor))
	//    attr.push_back("column_major");

	if (dec.decoration_flags.get(DecorationLocation) && can_use_io_location(type.storage, true))
		attr.push_back(join("location = ", dec.location));

	// Can only declare component if we can declare location.
	if (dec.decoration_flags.get(DecorationComponent) && can_use_io_location(type.storage, true))
	{
		if (!options.es)
		{
			if (options.version < 440 && options.version >= 140)
				require_extension_internal("GL_ARB_enhanced_layouts");
			else if (options.version < 140)
				SPIRV_CROSS_THROW("Component decoration is not supported in targets below GLSL 1.40.");
			attr.push_back(join("component = ", dec.component));
		}
		else
			SPIRV_CROSS_THROW("Component decoration is not supported in ES targets.");
	}

	// SPIRVCrossDecorationPacked is set by layout_for_variable earlier to mark that we need to emit offset qualifiers.
	// This is only done selectively in GLSL as needed.
	if (has_extended_decoration(type.self, SPIRVCrossDecorationExplicitOffset) &&
	    dec.decoration_flags.get(DecorationOffset))
		attr.push_back(join("offset = ", dec.offset));
	else if (type.storage == StorageClassOutput && dec.decoration_flags.get(DecorationOffset))
		attr.push_back(join("xfb_offset = ", dec.offset));

	if (attr.empty())
		return "";

	string res = "layout(";
	res += merge(attr);
	res += ") ";
	return res;
}